

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::MpRepeatedFixed<true>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  bool bVar6;
  int iVar7;
  int iVar8;
  int old_size;
  char *pcVar9;
  void *pvVar10;
  LongSooRep *pLVar11;
  int *piVar12;
  ulong uVar13;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar14;
  ParseContext *ctx_00;
  uint *puVar15;
  Arena *pAVar16;
  uint uVar17;
  long *plVar18;
  ushort *p;
  uint uVar19;
  pair<const_char_*,_unsigned_int> pVar21;
  LogMessageFatal local_40;
  uint uVar20;
  
  puVar15 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar15 & 3) != 0) {
    AlignFail(puVar15);
  }
  uVar20 = data.field_0._0_4_;
  uVar19 = uVar20 & 7;
  if (uVar19 == 2) {
    pcVar9 = MpPackedFixed<true>(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  pvVar10 = MaybeGetSplitBase(msg,true,table);
  uVar17 = *(ushort *)((long)puVar15 + 10) & 0x1c0;
  if ((ulong)uVar17 == 0xc0) {
    if (uVar19 != 1) {
LAB_0022341b:
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_00223470;
    }
    plVar18 = (long *)((long)pvVar10 + (ulong)*puVar15);
    if (((ulong)plVar18 & 7) != 0) {
LAB_00223518:
      AlignFail(plVar18);
    }
    pLVar11 = (LongSooRep *)*plVar18;
    if (pLVar11 == (LongSooRep *)kZeroBuffer) {
      pAVar16 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar16 & 1) != 0) {
        pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
      }
      if (pAVar16 == (Arena *)0x0) {
        pLVar11 = (LongSooRep *)operator_new(0x10);
        RepeatedField<unsigned_long>::RepeatedField
                  ((RepeatedField<unsigned_long> *)pLVar11,(Arena *)0x0);
      }
      else {
        pvVar10 = Arena::Allocate(pAVar16,0x10);
        local_40.super_LogMessage._0_8_ = pAVar16;
        pLVar11 = (LongSooRep *)
                  Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
                  Construct<google::protobuf::Arena*>(pvVar10,(Arena **)&local_40);
      }
      *plVar18 = (long)pLVar11;
    }
    do {
      uVar3 = *(undefined8 *)ptr;
      uVar13 = pLVar11->elements_int;
      iVar7 = SooRep::size((SooRep *)pLVar11,(uVar13 & 4) == 0);
      iVar8 = 1;
      if ((pLVar11->elements_int & 4) != 0) {
        iVar8 = pLVar11->capacity;
      }
      if (iVar7 == iVar8) {
        RepeatedField<unsigned_long>::Grow
                  ((RepeatedField<unsigned_long> *)pLVar11,(uVar13 & 4) == 0,iVar7,iVar7 + 1);
LAB_002231bc:
        piVar12 = (int *)LongSooRep::elements(pLVar11);
        bVar6 = false;
      }
      else {
        bVar6 = true;
        piVar12 = &pLVar11->size;
        if ((uVar13 & 4) != 0) goto LAB_002231bc;
      }
      iVar8 = SooRep::size((SooRep *)pLVar11,bVar6);
      if ((iVar8 != iVar7 + 1) && ((pLVar11->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar11);
      }
      RepeatedField<unsigned_long>::set_size
                ((RepeatedField<unsigned_long> *)pLVar11,bVar6,iVar7 + 1);
      *(undefined8 *)(piVar12 + (long)iVar8 * 2) = uVar3;
      p = (ushort *)(ptr + 8);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_00223485;
      bVar1 = ptr[8];
      auVar4[8] = bVar1;
      auVar4._0_8_ = ptr + 9;
      auVar4._9_3_ = 0;
      if ((char)bVar1 < '\0') {
        bVar2 = ptr[9];
        aVar14.data = (ulong)bVar2 << 7;
        uVar19 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pcVar9 = (char *)(ulong)uVar19;
          pVar21 = ReadTagFallback((char *)p,uVar19);
          auVar4 = pVar21._0_12_;
          ctx_00 = pVar21._8_8_;
          if (pVar21.first == (char *)0x0) {
LAB_002234ba:
            pcVar9 = Error(msg,pcVar9,ctx_00,(TcFieldData)aVar14,table,hasbits);
            return pcVar9;
          }
        }
        else {
          auVar4._8_4_ = uVar19;
          auVar4._0_8_ = ptr + 10;
        }
      }
      ptr = auVar4._0_8_;
    } while (auVar4._8_4_ == uVar20);
  }
  else {
    if (uVar17 != 0x80) {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              ((ulong)uVar17,0x80,
                               "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x7b7,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    if (uVar19 != 5) goto LAB_0022341b;
    plVar18 = (long *)((long)pvVar10 + (ulong)*puVar15);
    if (((ulong)plVar18 & 7) != 0) goto LAB_00223518;
    pLVar11 = (LongSooRep *)*plVar18;
    if (pLVar11 == (LongSooRep *)kZeroBuffer) {
      pAVar16 = (Arena *)(msg->_internal_metadata_).ptr_;
      if (((ulong)pAVar16 & 1) != 0) {
        pAVar16 = *(Arena **)((ulong)pAVar16 & 0xfffffffffffffffe);
      }
      if (pAVar16 == (Arena *)0x0) {
        pLVar11 = (LongSooRep *)operator_new(0x10);
        RepeatedField<unsigned_int>::RepeatedField
                  ((RepeatedField<unsigned_int> *)pLVar11,(Arena *)0x0);
      }
      else {
        pvVar10 = Arena::Allocate(pAVar16,0x10);
        local_40.super_LogMessage._0_8_ = pAVar16;
        pLVar11 = (LongSooRep *)
                  Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
                  Construct<google::protobuf::Arena*>(pvVar10,(Arena **)&local_40);
      }
      *plVar18 = (long)pLVar11;
    }
    do {
      iVar8 = *(int *)ptr;
      uVar13 = pLVar11->elements_int;
      old_size = SooRep::size((SooRep *)pLVar11,(uVar13 & 4) == 0);
      iVar7 = 2;
      if ((pLVar11->elements_int & 4) != 0) {
        iVar7 = pLVar11->capacity;
      }
      if (old_size == iVar7) {
        RepeatedField<unsigned_int>::Grow
                  ((RepeatedField<unsigned_int> *)pLVar11,(uVar13 & 4) == 0,old_size,old_size + 1);
LAB_0022334b:
        piVar12 = (int *)LongSooRep::elements(pLVar11);
        bVar6 = false;
      }
      else {
        bVar6 = true;
        piVar12 = &pLVar11->size;
        if ((uVar13 & 4) != 0) goto LAB_0022334b;
      }
      iVar7 = SooRep::size((SooRep *)pLVar11,bVar6);
      if ((iVar7 != old_size + 1) && ((pLVar11->elements_int & 4) != 0)) {
        LongSooRep::elements(pLVar11);
      }
      RepeatedField<unsigned_int>::set_size
                ((RepeatedField<unsigned_int> *)pLVar11,bVar6,old_size + 1);
      piVar12[iVar7] = iVar8;
      p = (ushort *)((long)ptr + 4);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= p) goto LAB_00223485;
      bVar1 = *(byte *)((long)ptr + 4);
      auVar5[8] = bVar1;
      auVar5._0_8_ = (byte *)((long)ptr + 5);
      auVar5._9_3_ = 0;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)((long)ptr + 5);
        aVar14.data = (ulong)bVar2 << 7;
        uVar19 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        if ((char)bVar2 < '\0') {
          pcVar9 = (char *)(ulong)uVar19;
          pVar21 = ReadTagFallback((char *)p,uVar19);
          auVar5 = pVar21._0_12_;
          ctx_00 = pVar21._8_8_;
          if (pVar21.first == (char *)0x0) goto LAB_002234ba;
        }
        else {
          auVar5._8_4_ = uVar19;
          auVar5._0_8_ = (long)ptr + 6;
        }
      }
      ptr = auVar5._0_8_;
    } while (auVar5._8_4_ == uVar20);
  }
  ptr = (char *)p;
  p = (ushort *)ptr;
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
LAB_00223485:
    if ((ulong)table->has_bits_offset != 0) {
      puVar15 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
      if (((ulong)puVar15 & 3) != 0) {
        AlignFail();
      }
      *puVar15 = *puVar15 | (uint)hasbits;
    }
    return (char *)p;
  }
  uVar19 = (uint)table->fast_idx_mask & (uint)*(ushort *)ptr;
  if ((uVar19 & 7) != 0) {
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x452);
  }
  uVar13 = (ulong)(uVar19 & 0xfffffff8);
  data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                 ((ulong)*(ushort *)ptr ^ *(ulong *)(&table[1].fast_idx_mask + uVar13 * 2));
  UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar13);
LAB_00223470:
  pcVar9 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
  return pcVar9;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedFixed(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  const uint16_t type_card = entry.type_card;
  const uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint64_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint64_t>(ptr);
      ptr += size;
      if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint32_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint32_t>(ptr);
      ptr += size;
      if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}